

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O1

void aom_invalidate_pyramid(ImagePyramid *pyr)

{
  if (pyr != (ImagePyramid *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)pyr);
    pyr->filled_levels = 0;
    pthread_mutex_unlock((pthread_mutex_t *)pyr);
    return;
  }
  return;
}

Assistant:

void aom_invalidate_pyramid(ImagePyramid *pyr) {
  if (pyr) {
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(&pyr->mutex);
#endif  // CONFIG_MULTITHREAD
    pyr->filled_levels = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(&pyr->mutex);
#endif  // CONFIG_MULTITHREAD
  }
}